

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-light.c
# Opt level: O0

void borg_update_light(void)

{
  _Bool _Var1;
  int local_40;
  int local_3c;
  int local_38;
  int dx;
  int dy;
  int p;
  int d;
  int max_y;
  int min_y;
  int max_x;
  int min_x;
  int y;
  int x;
  int i;
  
  for (y = 0; y < borg_light_n; y = y + 1) {
    borg_grids[(int)(uint)borg_light_y[y]][(int)(uint)borg_light_x[y]].info =
         borg_grids[(int)(uint)borg_light_y[y]][(int)(uint)borg_light_x[y]].info & 0xffef;
  }
  borg_light_n = 0;
  if (borg_items[(int)(z_info->pack_size + 5)].iqty != '\0') {
    borg_grids[borg.c.y][borg.c.x].info = borg_grids[borg.c.y][borg.c.x].info | 0x10;
    borg_light_y[borg_light_n] = (uint8_t)borg.c.y;
    borg_light_x[borg_light_n] = (uint8_t)borg.c.x;
    borg_light_n = borg_light_n + 1;
    if (0 < borg.trait[0x1a]) {
      borg_grids[borg.c.y + 1][borg.c.x].info = borg_grids[borg.c.y + 1][borg.c.x].info | 0x10;
      borg_light_y[borg_light_n] = (char)borg.c.y + '\x01';
      borg_light_x[borg_light_n] = (uint8_t)borg.c.x;
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y + -1][borg.c.x].info = borg_grids[borg.c.y + -1][borg.c.x].info | 0x10;
      borg_light_y[borg_light_n] = (char)borg.c.y + 0xff;
      borg_light_x[borg_light_n] = (uint8_t)borg.c.x;
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y][borg.c.x + 1].info = borg_grids[borg.c.y][borg.c.x + 1].info | 0x10;
      borg_light_y[borg_light_n] = (uint8_t)borg.c.y;
      borg_light_x[borg_light_n] = (char)borg.c.x + '\x01';
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y][borg.c.x + -1].info = borg_grids[borg.c.y][borg.c.x + -1].info | 0x10;
      borg_light_y[borg_light_n] = (uint8_t)borg.c.y;
      borg_light_x[borg_light_n] = (char)borg.c.x + 0xff;
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y + 1][borg.c.x + 1].info =
           borg_grids[borg.c.y + 1][borg.c.x + 1].info | 0x10;
      borg_light_y[borg_light_n] = (char)borg.c.y + '\x01';
      borg_light_x[borg_light_n] = (char)borg.c.x + '\x01';
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y + 1][borg.c.x + -1].info =
           borg_grids[borg.c.y + 1][borg.c.x + -1].info | 0x10;
      borg_light_y[borg_light_n] = (char)borg.c.y + '\x01';
      borg_light_x[borg_light_n] = (char)borg.c.x + 0xff;
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y + -1][borg.c.x + 1].info =
           borg_grids[borg.c.y + -1][borg.c.x + 1].info | 0x10;
      borg_light_y[borg_light_n] = (char)borg.c.y + 0xff;
      borg_light_x[borg_light_n] = (char)borg.c.x + '\x01';
      borg_light_n = borg_light_n + 1;
      borg_grids[borg.c.y + -1][borg.c.x + -1].info =
           borg_grids[borg.c.y + -1][borg.c.x + -1].info | 0x10;
      borg_light_y[borg_light_n] = (char)borg.c.y + 0xff;
      borg_light_x[borg_light_n] = (char)borg.c.x + 0xff;
      borg_light_n = borg_light_n + 1;
    }
    if ((((1 < borg.trait[0x1a]) && (borg.c.y + 2 < 0x42)) && (0 < borg.c.y + -2)) &&
       ((borg.c.x + 2 < 0xc6 && (0 < borg.c.x + -2)))) {
      _Var1 = borg_cave_floor_bold(borg.c.y + 2,borg.c.x);
      if (_Var1) {
        borg_grids[borg.c.y + 2][borg.c.x].info = borg_grids[borg.c.y + 2][borg.c.x].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x02';
        borg_light_x[borg_light_n] = (uint8_t)borg.c.x;
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + 2][borg.c.x + 2].info =
             borg_grids[borg.c.y + 2][borg.c.x + 2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x02';
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x02';
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + 2][borg.c.x + -2].info =
             borg_grids[borg.c.y + 2][borg.c.x + -2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x02';
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfe;
        borg_light_n = borg_light_n + 1;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y + -2,borg.c.x);
      if (_Var1) {
        borg_grids[borg.c.y + -2][borg.c.x].info = borg_grids[borg.c.y + -2][borg.c.x].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xfe;
        borg_light_x[borg_light_n] = (uint8_t)borg.c.x;
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + -2][borg.c.x + 2].info =
             borg_grids[borg.c.y + -2][borg.c.x + 2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xfe;
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x02';
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + -2][borg.c.x + -2].info =
             borg_grids[borg.c.y + -2][borg.c.x + -2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xfe;
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfe;
        borg_light_n = borg_light_n + 1;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y,borg.c.x + 2);
      if (_Var1) {
        borg_grids[borg.c.y][borg.c.x + 2].info = borg_grids[borg.c.y][borg.c.x + 2].info | 0x10;
        borg_light_y[borg_light_n] = (uint8_t)borg.c.y;
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x02';
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + 1][borg.c.x + 2].info =
             borg_grids[borg.c.y + 1][borg.c.x + 2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x01';
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x02';
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + -1][borg.c.x + 2].info =
             borg_grids[borg.c.y + -1][borg.c.x + 2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xff;
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x02';
        borg_light_n = borg_light_n + 1;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y,borg.c.x + -2);
      if (_Var1) {
        borg_grids[borg.c.y][borg.c.x + -2].info = borg_grids[borg.c.y][borg.c.x + -2].info | 0x10;
        borg_light_y[borg_light_n] = (uint8_t)borg.c.y;
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfe;
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + 2][borg.c.x + -2].info =
             borg_grids[borg.c.y + 2][borg.c.x + -2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x02';
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfe;
        borg_light_n = borg_light_n + 1;
        borg_grids[borg.c.y + -2][borg.c.x + -2].info =
             borg_grids[borg.c.y + -2][borg.c.x + -2].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xfe;
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfe;
        borg_light_n = borg_light_n + 1;
      }
    }
    if (((2 < borg.trait[0x1a]) && (borg.c.y + 3 < 0x42)) &&
       ((0 < borg.c.y + -3 && ((borg.c.x + 3 < 0xc6 && (0 < borg.c.x + -3)))))) {
      dx = borg.trait[0x1a];
      if (5 < dx) {
        dx = 5;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y + 3,borg.c.x + 3);
      if (_Var1) {
        borg_grids[borg.c.y + 3][borg.c.x + 3].info =
             borg_grids[borg.c.y + 3][borg.c.x + 3].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x03';
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y + 3,borg.c.x + -3);
      if (_Var1) {
        borg_grids[borg.c.y + 3][borg.c.x + -3].info =
             borg_grids[borg.c.y + 3][borg.c.x + -3].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + '\x03';
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y + -3,borg.c.x + 3);
      if (_Var1) {
        borg_grids[borg.c.y + -3][borg.c.x + 3].info =
             borg_grids[borg.c.y + -3][borg.c.x + 3].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xfd;
        borg_light_x[borg_light_n] = (char)borg.c.x + '\x03';
        borg_light_n = borg_light_n + 1;
      }
      _Var1 = borg_cave_floor_bold(borg.c.y + -3,borg.c.x + -3);
      if (_Var1) {
        borg_grids[borg.c.y + -3][borg.c.x + -3].info =
             borg_grids[borg.c.y + -3][borg.c.x + -3].info | 0x10;
        borg_light_y[borg_light_n] = (char)borg.c.y + 0xfd;
        borg_light_x[borg_light_n] = (char)borg.c.x + 0xfd;
        borg_light_n = borg_light_n + 1;
      }
      d = borg.c.y - dx;
      if (d < 0) {
        d = 0;
      }
      p = borg.c.y + dx;
      if (0x41 < p) {
        p = 0x41;
      }
      min_y = borg.c.x - dx;
      if (min_y < 0) {
        min_y = 0;
      }
      max_y = borg.c.x + dx;
      if (0xc5 < max_y) {
        max_y = 0xc5;
      }
      for (max_x = d; max_x <= p; max_x = max_x + 1) {
        for (min_x = min_y; min_x <= max_y; min_x = min_x + 1) {
          if (max_x < borg.c.y) {
            local_38 = borg.c.y - max_x;
          }
          else {
            local_38 = max_x - borg.c.y;
          }
          if (min_x < borg.c.x) {
            local_3c = borg.c.x - min_x;
          }
          else {
            local_3c = min_x - borg.c.x;
          }
          if ((2 < local_38) || (2 < local_3c)) {
            if (local_3c < local_38) {
              local_40 = local_38 + (local_3c >> 1);
            }
            else {
              local_40 = local_3c + (local_38 >> 1);
            }
            if ((local_40 <= dx) && ((borg_grids[max_x][min_x].info & 0x20) != 0)) {
              borg_grids[max_x][min_x].info = borg_grids[max_x][min_x].info | 0x10;
              borg_light_y[borg_light_n] = (uint8_t)max_x;
              borg_light_x[borg_light_n] = (uint8_t)min_x;
              borg_light_n = borg_light_n + 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void borg_update_light(void)
{
    int i, x, y, min_x, max_x, min_y, max_y;

    /*** Clear old grids ***/

    /* Clear them all */
    for (i = 0; i < borg_light_n; i++) {
        y = borg_light_y[i];
        x = borg_light_x[i];

        /* Mark the grid as not "lite" */
        borg_grids[y][x].info &= ~BORG_LIGHT;
    }

    /* None left */
    borg_light_n = 0;

    /* Hack -- Player has no lite */
    if (borg_items[INVEN_LIGHT].iqty <= 0)
        return;

    /*** Collect the new "lite" grids ***/

    /* Player grid */
    borg_cave_light_hack(borg.c.y, borg.c.x);

    /* Radius 1 -- torch radius */
    if (borg.trait[BI_LIGHT] >= 1) {
        /* Adjacent grid */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x);
        borg_cave_light_hack(borg.c.y, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y, borg.c.x - 1);

        /* Diagonal grids */
        borg_cave_light_hack(borg.c.y + 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y + 1, borg.c.x - 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x + 1);
        borg_cave_light_hack(borg.c.y - 1, borg.c.x - 1);
    }

    /* Radius 2 -- lantern radius */
    if (borg.trait[BI_LIGHT] >= 2 && borg.c.y + 2 < AUTO_MAX_Y
        && borg.c.y - 2 > 0 && borg.c.x + 2 < AUTO_MAX_X && borg.c.x - 2 > 0) {
        /* South of the player */
        if (borg_cave_floor_bold(borg.c.y + 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y + 2, borg.c.x);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
        }

        /* North of the player */
        if (borg_cave_floor_bold(borg.c.y - 2, borg.c.x)) {
            borg_cave_light_hack(borg.c.y - 2, borg.c.x);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }

        /* East of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x + 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y + 1, borg.c.x + 2);
            borg_cave_light_hack(borg.c.y - 1, borg.c.x + 2);
        }

        /* West of the player */
        if (borg_cave_floor_bold(borg.c.y, borg.c.x - 2)) {
            borg_cave_light_hack(borg.c.y, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y + 2, borg.c.x - 2);
            borg_cave_light_hack(borg.c.y - 2, borg.c.x - 2);
        }
    }

    /* Radius 3+ -- artifact radius */
    if (borg.trait[BI_LIGHT] >= 3 && borg.c.y + 3 < AUTO_MAX_Y
        && borg.c.y - 3 > 0 && borg.c.x + 3 < AUTO_MAX_X && borg.c.x - 3 > 0) {
        int d, p;

        /* Maximal radius */
        p = borg.trait[BI_LIGHT];

        /* Paranoia -- see "LITE_MAX" */
        if (p > 5)
            p = 5;

        /* South-East of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x + 3);
        }

        /* South-West of the player */
        if (borg_cave_floor_bold(borg.c.y + 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y + 3, borg.c.x - 3);
        }

        /* North-East of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x + 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x + 3);
        }

        /* North-West of the player */
        if (borg_cave_floor_bold(borg.c.y - 3, borg.c.x - 3)) {
            borg_cave_light_hack(borg.c.y - 3, borg.c.x - 3);
        }

        /* Maximal north */
        min_y = borg.c.y - p;
        if (min_y < 0)
            min_y = 0;

        /* Maximal south */
        max_y = borg.c.y + p;
        if (max_y > AUTO_MAX_Y - 1)
            max_y = AUTO_MAX_Y - 1;

        /* Maximal west */
        min_x = borg.c.x - p;
        if (min_x < 0)
            min_x = 0;

        /* Maximal east */
        max_x = borg.c.x + p;
        if (max_x > AUTO_MAX_X - 1)
            max_x = AUTO_MAX_X - 1;

        /* Scan the maximal box */
        for (y = min_y; y <= max_y; y++) {
            for (x = min_x; x <= max_x; x++) {
                int dy = (borg.c.y > y) ? (borg.c.y - y) : (y - borg.c.y);
                int dx = (borg.c.x > x) ? (borg.c.x - x) : (x - borg.c.x);

                /* Skip the "central" grids (above) */
                if ((dy <= 2) && (dx <= 2))
                    continue;

                /* Hack -- approximate the distance */
                d = (dy > dx) ? (dy + (dx >> 1)) : (dx + (dy >> 1));

                /* Skip distant grids */
                if (d > p)
                    continue;

                /* Viewable, nearby, grids get "torch lit" */
                if (borg_grids[y][x].info & BORG_VIEW) {
                    /* This grid is "torch lit" */
                    borg_cave_light_hack(y, x);
                }
            }
        }
    }
}